

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode Curl_GetFTPResponse(ssize_t *nreadp,connectdata *conn,int *ftpcode)

{
  Curl_easy *data_00;
  _Bool _Var1;
  int iVar2;
  time_t tVar3;
  uint *puVar4;
  time_t local_70;
  time_t interval_ms;
  time_t timeout;
  int value_to_be_ignored;
  int cache_skip;
  size_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  Curl_easy *pCStack_38;
  CURLcode result;
  Curl_easy *data;
  time_t *ptStack_28;
  curl_socket_t sockfd;
  int *ftpcode_local;
  connectdata *conn_local;
  ssize_t *nreadp_local;
  
  data._4_4_ = conn->sock[0];
  pCStack_38 = conn->data;
  ftpc._4_4_ = CURLE_OK;
  nread = (size_t)&conn->proto;
  timeout._4_4_ = 0;
  timeout._0_4_ = 0;
  if (ftpcode == (int *)0x0) {
    ptStack_28 = &timeout;
  }
  else {
    *ftpcode = 0;
    ptStack_28 = (time_t *)ftpcode;
  }
  *nreadp = 0;
  pp = (pingpong *)nread;
  ftpcode_local = (int *)conn;
  conn_local = (connectdata *)nreadp;
  do {
    while( true ) {
      if ((int)*ptStack_28 != 0 || ftpc._4_4_ != CURLE_OK) goto LAB_00823254;
      tVar3 = Curl_pp_state_timeout((pingpong *)nread,false);
      if (tVar3 < 1) {
        Curl_failf(pCStack_38,"FTP response timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      local_70 = 1000;
      if (tVar3 < 1000) {
        local_70 = tVar3;
      }
      if (((*(long *)nread == 0) || (1 < timeout._4_4_)) &&
         (_Var1 = Curl_conn_data_pending((connectdata *)ftpcode_local,0), !_Var1)) break;
LAB_008231ff:
      ftpc._4_4_ = ftp_readresp(data._4_4_,(pingpong *)nread,(int *)ptStack_28,
                                (size_t *)&value_to_be_ignored);
      if (ftpc._4_4_ != CURLE_OK) {
LAB_00823254:
        *(undefined1 *)(nread + 0x20) = 0;
        return ftpc._4_4_;
      }
      if ((_value_to_be_ignored == 0) && (*(long *)nread != 0)) {
        timeout._4_4_ = timeout._4_4_ + 1;
      }
      else {
        timeout._4_4_ = 0;
      }
      conn_local->data = (Curl_easy *)((long)&conn_local->data->next + _value_to_be_ignored);
    }
    iVar2 = Curl_socket_check(data._4_4_,-1,-1,local_70);
    data_00 = pCStack_38;
    if (iVar2 == -1) {
      puVar4 = (uint *)__errno_location();
      Curl_failf(data_00,"FTP response aborted due to select/poll error: %d",(ulong)*puVar4);
      return CURLE_RECV_ERROR;
    }
    if (iVar2 != 0) goto LAB_008231ff;
    iVar2 = Curl_pgrsUpdate((connectdata *)ftpcode_local);
    if (iVar2 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_GetFTPResponse(ssize_t *nreadp, /* return number of bytes read */
                             struct connectdata *conn,
                             int *ftpcode) /* return the ftp-code */
{
  /*
   * We cannot read just one byte per read() and then go back to select() as
   * the OpenSSL read() doesn't grok that properly.
   *
   * Alas, read as much as possible, split up into lines, use the ending
   * line in a response or continue reading.  */

  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  size_t nread;
  int cache_skip = 0;
  int value_to_be_ignored = 0;

  if(ftpcode)
    *ftpcode = 0; /* 0 for errors */
  else
    /* make the pointer point to something for the rest of this function */
    ftpcode = &value_to_be_ignored;

  *nreadp = 0;

  while(!*ftpcode && !result) {
    /* check and reset timeout value every lap */
    time_t timeout = Curl_pp_state_timeout(pp, FALSE);
    time_t interval_ms;

    if(timeout <= 0) {
      failf(data, "FTP response timeout");
      return CURLE_OPERATION_TIMEDOUT; /* already too little time */
    }

    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout < interval_ms)
      interval_ms = timeout;

    /*
     * Since this function is blocking, we need to wait here for input on the
     * connection and only then we call the response reading function. We do
     * timeout at least every second to make the timeout check run.
     *
     * A caution here is that the ftp_readresp() function has a cache that may
     * contain pieces of a response from the previous invoke and we need to
     * make sure we don't just wait for input while there is unhandled data in
     * that cache. But also, if the cache is there, we call ftp_readresp() and
     * the cache wasn't good enough to continue we must not just busy-loop
     * around this function.
     *
     */

    if(pp->cache && (cache_skip < 2)) {
      /*
       * There's a cache left since before. We then skipping the wait for
       * socket action, unless this is the same cache like the previous round
       * as then the cache was deemed not enough to act on and we then need to
       * wait for more data anyway.
       */
    }
    else if(!Curl_conn_data_pending(conn, FIRSTSOCKET)) {
      switch(SOCKET_READABLE(sockfd, interval_ms)) {
      case -1: /* select() error, stop reading */
        failf(data, "FTP response aborted due to select/poll error: %d",
              SOCKERRNO);
        return CURLE_RECV_ERROR;

      case 0: /* timeout */
        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;
        continue; /* just continue in our loop for the timeout duration */

      default: /* for clarity */
        break;
      }
    }
    result = ftp_readresp(sockfd, pp, ftpcode, &nread);
    if(result)
      break;

    if(!nread && pp->cache)
      /* bump cache skip counter as on repeated skips we must wait for more
         data */
      cache_skip++;
    else
      /* when we got data or there is no cache left, we reset the cache skip
         counter */
      cache_skip = 0;

    *nreadp += nread;

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}